

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawable.cpp
# Opt level: O2

void __thiscall
dlib::drawable_window::set_background_color
          (drawable_window *this,unsigned_long red_,unsigned_long green_,unsigned_long blue_)

{
  unsigned_long height;
  unsigned_long width;
  rectangle local_48;
  
  rmutex::lock((this->super_base_window).wm,1);
  (this->bg_color).red = (uchar)red_;
  (this->bg_color).green = (uchar)green_;
  (this->bg_color).blue = (uchar)blue_;
  rmutex::unlock((this->super_base_window).wm,1);
  base_window::get_size(&this->super_base_window,&width,&height);
  local_48.r = width - 1;
  local_48.b = height - 1;
  local_48.l = 0;
  local_48.t = 0;
  base_window::invalidate_rectangle(&this->super_base_window,&local_48);
  return;
}

Assistant:

void drawable_window::
    set_background_color (
        unsigned long red_,
        unsigned long green_,
        unsigned long blue_
    )
    {
        wm.lock();
        bg_color.red = red_;
        bg_color.green = green_;
        bg_color.blue = blue_;
        wm.unlock();
        // now repaint the window
        unsigned long width,height;
        get_size(width,height);
        rectangle rect(0,0,width-1,height-1);
        invalidate_rectangle(rect);
    }